

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbustraytypes.cpp
# Opt level: O3

QDBusArgument * operator>>(QDBusArgument *argument,QXdgDBusImageStruct *icon)

{
  long in_FS_OFFSET;
  qint32 height;
  qint32 width;
  QByteArray local_58;
  int local_38;
  int local_34;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_34 = -0x55555556;
  local_38 = -0x55555556;
  local_58.d.d = (Data *)0x0;
  local_58.d.ptr = (char *)0x0;
  local_58.d.size = 0;
  QDBusArgument::beginStructure();
  QDBusArgument::operator>>(argument,&local_34);
  QDBusArgument::operator>>(argument,&local_38);
  QDBusArgument::operator>>(argument,&local_58);
  QDBusArgument::endStructure();
  icon->width = local_34;
  icon->height = local_38;
  QByteArray::operator=(&icon->data,&local_58);
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return argument;
  }
  __stack_chk_fail();
}

Assistant:

const QDBusArgument &operator>>(const QDBusArgument &argument, QXdgDBusImageStruct &icon)
{
    qint32 width;
    qint32 height;
    QByteArray data;

    argument.beginStructure();
    argument >> width;
    argument >> height;
    argument >> data;
    argument.endStructure();

    icon.width = width;
    icon.height = height;
    icon.data = data;

    return argument;
}